

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynomialfit.cpp
# Opt level: O2

bool __thiscall PolynomialFit::process(PolynomialFit *this)

{
  fraction *pfVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  AugmentedMatrix am;
  AugmentedMatrix AStack_328;
  
  bVar2 = leastQuare(this);
  if (bVar2) {
    AugmentedMatrix::AugmentedMatrix(&AStack_328);
    AugmentedMatrix::setMatrixData(&AStack_328,this->matrix,this->multiterm,this->multiterm);
    AugmentedMatrix::setAugmentData(&AStack_328,this->rvector,this->multiterm);
    bVar2 = AugmentedMatrix::process(&AStack_328);
    if (bVar2) {
      pfVar1 = this->results;
      uVar4 = 0;
      uVar3 = (ulong)(uint)this->multiterm;
      if (this->multiterm < 1) {
        uVar3 = uVar4;
      }
      for (; uVar3 * 0x10 != uVar4; uVar4 = uVar4 + 0x10) {
        *(unkbyte10 *)((long)pfVar1 + uVar4) = *(unkbyte10 *)((long)AStack_328.augment + uVar4);
      }
    }
    AugmentedMatrix::~AugmentedMatrix(&AStack_328);
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool PolynomialFit::process()
{
    // ������С���˷���һ�η�����
    if(!leastQuare())
        return false;

    // ͨ����˹���ⷽ����
    AugmentedMatrix am;
    am.setMatrixData( matrix , multiterm , multiterm ) ;
    am.setAugmentData( rvector , multiterm);
    if( !am.process() )
        return false;

    // �����Ľ������Ƕ���ʽ��ϵ��
    for(int i=0;i<multiterm;i++){
        results[i] = am.getResult(i);
    }

    return true;
}